

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * random_bigint(BigInt *__return_storage_ptr__,int n)

{
  result_type rVar1;
  int local_3c;
  string local_38 [4];
  int i;
  string s;
  int n_local;
  
  std::__cxx11::string::string(local_38);
  for (local_3c = 0; local_3c < n; local_3c = local_3c + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()(dis,gen);
    std::__cxx11::string::operator+=(local_38,(char)rVar1 + '0' + (char)(rVar1 / 10) * -10);
  }
  BigInt::BigInt(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

BigInt random_bigint(int n) {
    string s;
    for (int i = 0; i < n; i++)
        s += (*dis)(*gen) % 10 + '0';

    return BigInt(s);
}